

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall Units_unitAttributes_Test::TestBody(Units_unitAttributes_Test *this)

{
  element_type *peVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  Message local_f8 [32];
  AssertHelper local_d8 [39];
  allocator<char> local_b1;
  double multiplier;
  double exponent;
  allocator<char> local_9a;
  allocator<char> local_99;
  UnitsPtr u;
  string prefix;
  string reference;
  ModelPtr m;
  string id;
  
  libcellml::Model::create();
  libcellml::Units::create();
  peVar1 = u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reference,"fahrenheitish",(allocator<char> *)&prefix);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)&reference);
  peVar1 = u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reference,"kelvin",(allocator<char> *)&id);
  pcVar2 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&prefix,"",(allocator<char> *)&gtest_ar);
  libcellml::Units::addUnit((string *)peVar1,(int)&reference,1.0,1.8,(string *)0x0);
  std::__cxx11::string::~string((string *)&prefix);
  std::__cxx11::string::~string((string *)&reference);
  libcellml::Model::addUnits
            ((shared_ptr *)m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  reference._M_dataplus._M_p = (pointer)&reference.field_2;
  reference._M_string_length = 0;
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  prefix._M_string_length = 0;
  id._M_dataplus._M_p = (pointer)&id.field_2;
  id._M_string_length = 0;
  reference.field_2._M_local_buf[0] = '\0';
  prefix.field_2._M_local_buf[0] = '\0';
  id.field_2._M_local_buf[0] = '\0';
  libcellml::Units::unitAttributes
            ((ulong)u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)0x0,(string *)&reference,(double *)&prefix,&exponent,(string *)&multiplier);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"kelvin\"","reference",(char (*) [7])"kelvin",&reference);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(local_f8);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2ef,pcVar2);
    testing::internal::AssertHelper::operator=(local_d8,local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\"","prefix",(char (*) [1])0x14bb90,&prefix);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(local_f8);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2f0,pcVar2);
    testing::internal::AssertHelper::operator=(local_d8,local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"1.0","exponent",1.0,exponent);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(local_f8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2f1,pcVar2);
    testing::internal::AssertHelper::operator=(local_d8,local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"1.8","multiplier",1.8,multiplier);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(local_f8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2f2,pcVar2);
    testing::internal::AssertHelper::operator=(local_d8,local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  peVar1 = u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"NewUnit",(allocator<char> *)local_d8);
  pcVar2 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_f8,"",&local_b1);
  libcellml::Units::addUnit((string *)peVar1,(int)&gtest_ar,1.05,17.0,(string *)0x4);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::Units::unitAttributes
            ((ulong)u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)0x1,(string *)&reference,(double *)&prefix,&exponent,(string *)&multiplier);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"NewUnit\"","reference",(char (*) [8])"NewUnit",&reference);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(local_f8);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2f6,pcVar2);
    testing::internal::AssertHelper::operator=(local_d8,local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"4\"","prefix",(char (*) [2])0x14bbb9,&prefix);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(local_f8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2f7,pcVar2);
    testing::internal::AssertHelper::operator=(local_d8,local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"1.05","exponent",1.05,exponent);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(local_f8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2f8,pcVar2);
    testing::internal::AssertHelper::operator=(local_d8,local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"17","multiplier",17.0,multiplier);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(local_f8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2f9,pcVar2);
    testing::internal::AssertHelper::operator=(local_d8,local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Units::unitAttributes
            ((ulong)u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)0x2,(string *)&reference,(double *)&prefix,&exponent,(string *)&multiplier);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\"","reference",(char (*) [1])0x14bb90,&reference);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(local_f8);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2fd,pcVar2);
    testing::internal::AssertHelper::operator=(local_d8,local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\"","prefix",(char (*) [1])0x14bb90,&prefix);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(local_f8);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2fe,pcVar2);
    testing::internal::AssertHelper::operator=(local_d8,local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"1","exponent",1.0,exponent);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(local_f8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2ff,pcVar2);
    testing::internal::AssertHelper::operator=(local_d8,local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"1","multiplier",1.0,multiplier);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(local_f8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x300,pcVar2);
    testing::internal::AssertHelper::operator=(local_d8,local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  peVar1 = u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar,"daves",&local_b1);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_f8,"house",&local_99);
  pcVar2 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_d8,"",&local_9a);
  libcellml::Units::addUnit((string *)peVar1,(string *)&gtest_ar,1.0,1.0,(string *)local_f8);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::Units::unitAttributes
            ((ulong)u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)0x2,(string *)&reference,(double *)&prefix,&exponent,(string *)&multiplier);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"daves\"","reference",(char (*) [6])"daves",&reference);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(local_f8);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x304,pcVar2);
    testing::internal::AssertHelper::operator=(local_d8,local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"house\"","prefix",(char (*) [6])"house",&prefix);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(local_f8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x305,pcVar2);
    testing::internal::AssertHelper::operator=(local_d8,local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  peVar1 = u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"daves",(allocator<char> *)local_f8);
  libcellml::Units::unitAttributes
            ((string *)peVar1,(string *)&gtest_ar,(double *)&prefix,&exponent,(string *)&multiplier)
  ;
  std::__cxx11::string::~string((string *)&gtest_ar);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"daves\"","reference",(char (*) [6])"daves",&reference);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(local_f8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x308,pcVar2);
    testing::internal::AssertHelper::operator=(local_d8,local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"house\"","prefix",(char (*) [6])"house",&prefix);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(local_f8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x309,pcVar2);
    testing::internal::AssertHelper::operator=(local_d8,local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"kelvin",(allocator<char> *)local_f8);
  libcellml::Units::unitAttributes
            ((string *)u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)&gtest_ar,(double *)&prefix,&exponent,(string *)&multiplier);
  std::__cxx11::string::~string((string *)&gtest_ar);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\"","prefix",(char (*) [1])0x14bb90,&prefix);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(local_f8);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x30c,pcVar2);
    testing::internal::AssertHelper::operator=(local_d8,local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"1.0","exponent",1.0,exponent);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(local_f8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x30d,pcVar2);
    testing::internal::AssertHelper::operator=(local_d8,local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"1.8","multiplier",1.8,multiplier);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(local_f8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x30e,pcVar2);
    testing::internal::AssertHelper::operator=(local_d8,local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&id);
  std::__cxx11::string::~string((string *)&prefix);
  std::__cxx11::string::~string((string *)&reference);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, unitAttributes)
{
    libcellml::ModelPtr m = libcellml::Model::create();

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("fahrenheitish");

    /* Give prefix and exponent their default values. */
    u->addUnit("kelvin", 0, 1.0, 1.8);
    m->addUnits(u);

    std::string reference;
    std::string prefix;
    std::string id;
    double exponent;
    double multiplier;
    u->unitAttributes(0, reference, prefix, exponent, multiplier, id);
    EXPECT_EQ("kelvin", reference);
    EXPECT_EQ("", prefix);
    EXPECT_DOUBLE_EQ(1.0, exponent);
    EXPECT_DOUBLE_EQ(1.8, multiplier);

    u->addUnit("NewUnit", 4, 1.05, 17.0);
    u->unitAttributes(1, reference, prefix, exponent, multiplier, id);
    EXPECT_EQ("NewUnit", reference);
    EXPECT_EQ("4", prefix);
    EXPECT_DOUBLE_EQ(1.05, exponent);
    EXPECT_DOUBLE_EQ(17, multiplier);

    // Get non-existent unit.
    u->unitAttributes(2, reference, prefix, exponent, multiplier, id);
    EXPECT_EQ("", reference);
    EXPECT_EQ("", prefix);
    EXPECT_DOUBLE_EQ(1, exponent);
    EXPECT_DOUBLE_EQ(1, multiplier);

    u->addUnit("daves", "house");
    u->unitAttributes(2, reference, prefix, exponent, multiplier, id);
    EXPECT_EQ("daves", reference);
    EXPECT_EQ("house", prefix);

    u->unitAttributes("daves", prefix, exponent, multiplier, id);
    EXPECT_EQ("daves", reference);
    EXPECT_EQ("house", prefix);

    u->unitAttributes("kelvin", prefix, exponent, multiplier, id);
    EXPECT_EQ("", prefix);
    EXPECT_DOUBLE_EQ(1.0, exponent);
    EXPECT_DOUBLE_EQ(1.8, multiplier);
}